

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int parse_rockridge(archive_read *a,file_info *file,uchar *p,uchar *end)

{
  uint *p_00;
  archive_string *as;
  archive_string *as_00;
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *pvVar6;
  void *pvVar7;
  void *__src;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  void *__dest;
  time_t tVar11;
  uint uVar12;
  ulong *puVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  byte *pbVar19;
  
  pvVar6 = a->format->data;
  as = &file->symlink;
  as_00 = &file->name;
  do {
    p_00 = (uint *)(p + 4);
    if (end < p_00) {
      return 0;
    }
    bVar2 = *p;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      return 0;
    }
    bVar3 = p[1];
    if (0x19 < (byte)(bVar3 + 0xbf)) {
      return 0;
    }
    bVar4 = p[2];
    if ((ulong)bVar4 < 4) {
      return 0;
    }
    if (end < p + bVar4) {
      return 0;
    }
    uVar12 = bVar4 - 4;
    bVar5 = p[3];
    if (0xc < bVar2 - 0x4e) {
      if (bVar2 == 0x43) {
        if (bVar3 == 0x4c) {
          if (uVar12 == 8 && bVar5 == 1) {
            file->cl_offset = (ulong)*p_00 * *(long *)((long)pvVar6 + 0xa8);
            goto switchD_003a7742_caseD_3;
          }
        }
        else if ((bVar3 == 0x45) && (uVar12 == 0x18 && bVar5 == 1)) {
          iVar17 = *(int *)(p + 4);
          uVar12 = *(uint *)(p + 0xc);
          file->ce_offset = uVar12;
          uVar9 = *(uint *)(p + 0x14);
          file->ce_size = uVar9;
          pvVar7 = a->format->data;
          uVar18 = (long)iVar17 * *(ulong *)((long)pvVar7 + 0xa8);
          if ((((file->mode & 0xf000) == 0x8000) && (file->offset <= uVar18)) ||
             (((uVar18 < *(ulong *)((long)pvVar7 + 0xa0) ||
               (uVar10 = (ulong)uVar9 + (ulong)uVar12, *(ulong *)((long)pvVar7 + 0xa8) < uVar10)) ||
              (*(ulong *)((long)pvVar7 + 0xb0) < uVar10 + uVar18)))) {
            pcVar15 = "Invalid parameter in SUSP \"CE\" extension";
            iVar17 = -1;
LAB_003a7e75:
            archive_set_error(&a->archive,iVar17,pcVar15);
            return -0x1e;
          }
          uVar12 = *(uint *)((long)pvVar7 + 0x40);
          iVar17 = *(int *)((long)pvVar7 + 0x44);
          if (iVar17 <= (int)uVar12) {
            uVar9 = iVar17 * 2;
            if (iVar17 < 0x10) {
              uVar9 = 0x10;
            }
            if (((int)uVar9 <= iVar17) ||
               (__dest = calloc((ulong)uVar9,0x10), __dest == (void *)0x0)) {
              pcVar15 = "Out of memory";
              iVar17 = 0xc;
              goto LAB_003a7e75;
            }
            __src = *(void **)((long)pvVar7 + 0x38);
            if (__src != (void *)0x0) {
              memcpy(__dest,__src,(long)(int)uVar12 << 4);
              free(__src);
              uVar12 = *(uint *)((long)pvVar7 + 0x40);
            }
            *(void **)((long)pvVar7 + 0x38) = __dest;
            *(uint *)((long)pvVar7 + 0x44) = uVar9;
          }
          *(uint *)((long)pvVar7 + 0x40) = uVar12 + 1;
          while (0 < (int)uVar12) {
            uVar9 = uVar12 - 1 >> 1;
            lVar8 = *(long *)((long)pvVar7 + 0x38);
            lVar14 = (ulong)uVar9 * 0x10;
            puVar1 = (ulong *)(lVar8 + (ulong)uVar12 * 0x10);
            if (*(ulong *)(lVar8 + lVar14) <= uVar18) {
              *puVar1 = uVar18;
              *(file_info **)(lVar8 + 8 + (ulong)uVar12 * 0x10) = file;
              goto switchD_003a76f0_caseD_4f;
            }
            puVar13 = (ulong *)(lVar8 + lVar14);
            uVar10 = puVar13[1];
            *puVar1 = *puVar13;
            puVar1[1] = uVar10;
            uVar12 = uVar9;
          }
          puVar1 = *(ulong **)((long)pvVar7 + 0x38);
          *puVar1 = uVar18;
          puVar1[1] = (ulong)file;
        }
      }
      goto switchD_003a76f0_caseD_4f;
    }
    uVar9 = (uint)bVar4;
    switch((uint)bVar2) {
    case 0x4e:
      if (bVar5 != 1 || bVar3 != 0x4d) break;
      if (file->name_continues == '\0') {
        (file->name).length = 0;
      }
      file->name_continues = '\0';
      if (bVar4 < 5) goto switchD_003a7742_caseD_3;
      switch((byte)*p_00) {
      case 0:
        if (uVar12 != 1) {
          archive_strncat(as_00,p + 5,(ulong)(uVar9 - 5));
        }
        break;
      case 1:
        if (uVar12 != 1) {
          archive_strncat(as_00,p + 5,(ulong)(uVar9 - 5));
          file->name_continues = '\x01';
        }
        break;
      case 2:
        pcVar15 = ".";
        goto LAB_003a7e39;
      case 4:
        pcVar15 = "..";
LAB_003a7e39:
        archive_strcat(as_00,pcVar15);
      }
switchD_003a7742_caseD_3:
      *(undefined1 *)((long)pvVar6 + 0x28) = 1;
      break;
    case 0x50:
      if (bVar3 == 0x4e) {
        if (uVar12 == 0x10 && bVar5 == 1) {
          uVar12 = toi(p_00,4);
          file->rdev = (ulong)uVar12 << 0x20;
          uVar9 = toi(p + 0xc,4);
          file->rdev = CONCAT44(uVar12,uVar9);
          goto switchD_003a7742_caseD_3;
        }
      }
      else if (bVar5 == 1 && bVar3 == 0x58) {
        if (0xb < bVar4) {
          uVar12 = toi(p_00,4);
          file->mode = uVar12;
          if (0x13 < bVar4) {
            uVar12 = toi(p + 0xc,4);
            file->nlinks = uVar12;
            if (0x1b < bVar4) {
              uVar12 = toi(p + 0x14,4);
              file->uid = uVar12;
              if (0x23 < bVar4) {
                uVar12 = toi(p + 0x1c,4);
                file->gid = uVar12;
                if (0x2b < bVar4) {
                  uVar12 = toi(p + 0x24,4);
                  file->number = (ulong)uVar12;
                }
              }
            }
          }
        }
        goto switchD_003a7742_caseD_3;
      }
      break;
    case 0x52:
      if (bVar5 == 1 && bVar3 == 0x45) {
        file->re = '\x01';
        *(undefined1 *)((long)pvVar6 + 0x28) = 1;
      }
      break;
    case 0x53:
      if (bVar3 == 0x4c) {
        if (bVar5 == 1) {
          if ((file->symlink_continues == '\0') || ((file->symlink).length == 0)) {
            (file->symlink).length = 0;
          }
          file->symlink_continues = '\0';
          if (4 < bVar4) {
            if ((byte)*p_00 != 0) {
              if ((byte)*p_00 != 1) goto switchD_003a79f9_caseD_3;
              file->symlink_continues = '\x01';
            }
            pbVar19 = p + 5;
            pcVar15 = "";
            iVar17 = uVar9 - 5;
            while (1 < iVar17) {
              bVar2 = *pbVar19;
              bVar3 = pbVar19[1];
              pbVar19 = pbVar19 + 2;
              uVar12 = iVar17 - 2;
              archive_strcat(as,pcVar15);
              switch(bVar2) {
              case 0:
                if (bVar3 <= uVar12) {
                  archive_strncat(as,pbVar19,(ulong)(uint)bVar3);
                  goto LAB_003a7aa6;
                }
                goto switchD_003a79f9_caseD_3;
              case 1:
                if (bVar3 <= uVar12) {
                  archive_strncat(as,pbVar19,(ulong)bVar3);
                  goto LAB_003a7a7f;
                }
                goto switchD_003a79f9_caseD_3;
              case 2:
                pcVar15 = ".";
                break;
              case 3:
              case 5:
              case 6:
              case 7:
                goto switchD_003a79f9_caseD_3;
              case 4:
                pcVar15 = "..";
                break;
              case 8:
                archive_strcat(as,"/");
LAB_003a7a7f:
                pcVar15 = "";
                goto LAB_003a7aad;
              default:
                if (bVar2 == 0x10) {
                  (file->symlink).length = 0;
                  pcVar15 = "ROOT";
                }
                else {
                  if (bVar2 != 0x20) goto switchD_003a79f9_caseD_3;
                  pcVar15 = "hostname";
                }
              }
              archive_strcat(as,pcVar15);
LAB_003a7aa6:
              pcVar15 = "/";
LAB_003a7aad:
              pbVar19 = pbVar19 + bVar3;
              iVar17 = uVar12 - bVar3;
            }
          }
switchD_003a79f9_caseD_3:
          *(undefined1 *)((long)pvVar6 + 0x28) = 1;
        }
      }
      else if (((bVar3 == 0x54) && (bVar4 == 4)) && (bVar5 == 1)) {
        *(undefined2 *)((long)pvVar6 + 0x28) = 0;
        return 0;
      }
      break;
    case 0x54:
      if (bVar5 == 1 && bVar3 == 0x46) {
        if (4 < bVar4) {
          bVar2 = p[4];
          pbVar19 = p + 5;
          uVar16 = bVar4 - 5;
          if ((char)bVar2 < '\0') {
            if (0x11 < uVar12 && (bVar2 & 1) != 0) {
              file->birthtime_is_set = 1;
              tVar11 = isodate17(pbVar19);
              file->birthtime = tVar11;
              pbVar19 = p + 0x16;
              uVar16 = uVar9 - 0x16;
            }
            if (((bVar2 & 2) != 0) && (0x10 < uVar16)) {
              tVar11 = isodate17(pbVar19);
              file->mtime = tVar11;
              pbVar19 = pbVar19 + 0x11;
              uVar16 = uVar16 - 0x11;
            }
            if (((bVar2 & 4) != 0) && (0x10 < uVar16)) {
              tVar11 = isodate17(pbVar19);
              file->atime = tVar11;
              pbVar19 = pbVar19 + 0x11;
              uVar16 = uVar16 - 0x11;
            }
            if (((bVar2 & 8) != 0) && (0x10 < uVar16)) {
              tVar11 = isodate17(pbVar19);
              goto LAB_003a7dbd;
            }
          }
          else {
            if (7 < uVar12 && (bVar2 & 1) != 0) {
              file->birthtime_is_set = 1;
              tVar11 = isodate7(pbVar19);
              file->birthtime = tVar11;
              pbVar19 = p + 0xc;
              uVar16 = uVar9 - 0xc;
            }
            if (((bVar2 & 2) != 0) && (6 < uVar16)) {
              tVar11 = isodate7(pbVar19);
              file->mtime = tVar11;
              pbVar19 = pbVar19 + 7;
              uVar16 = uVar16 - 7;
            }
            if (((bVar2 & 4) != 0) && (6 < uVar16)) {
              tVar11 = isodate7(pbVar19);
              file->atime = tVar11;
              pbVar19 = pbVar19 + 7;
              uVar16 = uVar16 - 7;
            }
            if (((bVar2 & 8) != 0) && (6 < uVar16)) {
              tVar11 = isodate7(pbVar19);
LAB_003a7dbd:
              file->ctime = tVar11;
            }
          }
        }
        goto switchD_003a7742_caseD_3;
      }
      break;
    case 0x5a:
      if (((bVar5 == 1 && bVar3 == 0x46) && ((byte)*p_00 == 0x70)) &&
         ((uVar12 == 0xc && (p[5] == 0x7a)))) {
        file->pz = 1;
        file->pz_log2_bs = (uint)p[7];
        file->pz_uncompressed_size = (ulong)*(uint *)(p + 8);
      }
    }
switchD_003a76f0_caseD_4f:
    p = p + p[2];
  } while( true );
}

Assistant:

static int
parse_rockridge(struct archive_read *a, struct file_info *file,
    const unsigned char *p, const unsigned char *end)
{
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	while (p + 4 <= end  /* Enough space for another entry. */
	    && p[0] >= 'A' && p[0] <= 'Z' /* Sanity-check 1st char of name. */
	    && p[1] >= 'A' && p[1] <= 'Z' /* Sanity-check 2nd char of name. */
	    && p[2] >= 4 /* Sanity-check length. */
	    && p + p[2] <= end) { /* Sanity-check length. */
		const unsigned char *data = p + 4;
		int data_length = p[2] - 4;
		int version = p[3];

		switch(p[0]) {
		case 'C':
			if (p[1] == 'E') {
				if (version == 1 && data_length == 24) {
					/*
					 * CE extension comprises:
					 *   8 byte sector containing extension
					 *   8 byte offset w/in above sector
					 *   8 byte length of continuation
					 */
					int32_t location =
					    archive_le32dec(data);
					file->ce_offset =
					    archive_le32dec(data+8);
					file->ce_size =
					    archive_le32dec(data+16);
					if (register_CE(a, location, file)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
			}
			else if (p[1] == 'L') {
				if (version == 1 && data_length == 8) {
					file->cl_offset = (uint64_t)
					    iso9660->logical_block_size *
					    (uint64_t)archive_le32dec(data);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'N':
			if (p[1] == 'M') {
				if (version == 1) {
					parse_rockridge_NM1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'P':
			/*
			 * PD extension is padding;
			 * contents are always ignored.
			 *
			 * PL extension won't appear;
			 * contents are always ignored.
			 */
			if (p[1] == 'N') {
				if (version == 1 && data_length == 16) {
					file->rdev = toi(data,4);
					file->rdev <<= 32;
					file->rdev |= toi(data + 8, 4);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'X') {
				/*
				 * PX extension comprises:
				 *   8 bytes for mode,
				 *   8 bytes for nlinks,
				 *   8 bytes for uid,
				 *   8 bytes for gid,
				 *   8 bytes for inode.
				 */
				if (version == 1) {
					if (data_length >= 8)
						file->mode
						    = toi(data, 4);
					if (data_length >= 16)
						file->nlinks
						    = toi(data + 8, 4);
					if (data_length >= 24)
						file->uid
						    = toi(data + 16, 4);
					if (data_length >= 32)
						file->gid
						    = toi(data + 24, 4);
					if (data_length >= 40)
						file->number
						    = toi(data + 32, 4);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'R':
			if (p[1] == 'E' && version == 1) {
				file->re = 1;
				iso9660->seenRockridge = 1;
			}
			else if (p[1] == 'R' && version == 1) {
				/*
				 * RR extension comprises:
				 *    one byte flag value
				 * This extension is obsolete,
				 * so contents are always ignored.
				 */
			}
			break;
		case 'S':
			if (p[1] == 'L') {
				if (version == 1) {
					parse_rockridge_SL1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'T'
			    && data_length == 0 && version == 1) {
				/*
				 * ST extension marks end of this
				 * block of SUSP entries.
				 *
				 * It allows SUSP to coexist with
				 * non-SUSP uses of the System
				 * Use Area by placing non-SUSP data
				 * after SUSP data.
				 */
				iso9660->seenSUSP = 0;
				iso9660->seenRockridge = 0;
				return (ARCHIVE_OK);
			}
			break;
		case 'T':
			if (p[1] == 'F') {
				if (version == 1) {
					parse_rockridge_TF1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'Z':
			if (p[1] == 'F') {
				if (version == 1)
					parse_rockridge_ZF1(file,
					    data, data_length);
			}
			break;
		default:
			break;
		}

		p += p[2];
	}
	return (ARCHIVE_OK);
}